

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_local_file_header(archive_read *a,archive_entry *entry,zip *zip)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  unsigned_long uVar7;
  archive_string_conv *paVar8;
  int *piVar9;
  int64_t iVar10;
  ulong min;
  ulong min_00;
  char *pcVar11;
  wchar_t *pwVar12;
  wchar_t *pwVar13;
  size_t sVar14;
  bool bVar15;
  size_t local_1b8;
  size_t local_1a8;
  size_t local_198;
  void *local_180;
  void *uncompressed_buffer;
  size_t sStack_170;
  wchar_t status;
  size_t linkname_full_length;
  size_t linkname_length;
  archive_string s_2;
  archive_wstring s_1;
  undefined1 auStack_128 [4];
  wchar_t has_slash;
  archive_wstring s;
  size_t i;
  undefined1 local_100 [3];
  char version;
  wchar_t ret;
  zip_entry zip_entry_central_dir;
  zip_entry *zip_entry;
  archive_string_conv *sconv;
  size_t extra_length;
  size_t filename_length;
  size_t len;
  char *cp;
  wchar_t *wp;
  void *h;
  char *p;
  zip *zip_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  zip_entry_central_dir.aes_extra._4_8_ = zip->entry;
  i._4_4_ = L'\0';
  memcpy(local_100,(void *)zip_entry_central_dir.aes_extra._4_8_,0x90);
  zip->decompress_init = '\0';
  zip->end_of_entry = '\0';
  zip->entry_uncompressed_bytes_read = 0;
  zip->entry_compressed_bytes_read = 0;
  uVar7 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->computed_crc32 = uVar7;
  if ((zip->sconv == (archive_string_conv *)0x0) && (zip->init_default_conversion == 0)) {
    paVar8 = archive_string_default_conversion_for_read(&a->archive);
    zip->sconv_default = paVar8;
    zip->init_default_conversion = 1;
  }
  piVar9 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar9 == (int *)0x0) {
    archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
    a_local._4_4_ = L'\xffffffe2';
  }
  else if (*piVar9 == 0x4034b50) {
    iVar3 = piVar9[1];
    *(undefined1 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x81) =
         *(undefined1 *)((long)piVar9 + 5);
    uVar4 = archive_le16dec((void *)((long)piVar9 + 6));
    *(uint16_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) = uVar4;
    if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 0x41) != 0) {
      zip->has_encrypted_entries = 1;
      archive_entry_set_is_data_encrypted(entry,'\x01');
      if ((((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 0x2000) != 0) &&
          ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 1) != 0)) &&
         ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 0x40) != 0)) {
        archive_entry_set_is_metadata_encrypted(entry,'\x01');
        return L'\xffffffe2';
      }
    }
    zip->init_decryption = (byte)*(undefined2 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 1;
    uVar4 = archive_le16dec(piVar9 + 2);
    *(char *)(zip_entry_central_dir.aes_extra._4_8_ + 0x80) = (char)uVar4;
    uVar5 = archive_le32dec((void *)((long)piVar9 + 10));
    iVar10 = dos_to_unix(uVar5);
    *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x60) = iVar10;
    uVar5 = archive_le32dec((void *)((long)piVar9 + 0xe));
    *(uint32_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x78) = uVar5;
    if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 8) == 0) {
      *(undefined1 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x83) =
           *(undefined1 *)((long)piVar9 + 0x11);
    }
    else {
      *(undefined1 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x83) =
           *(undefined1 *)((long)piVar9 + 0xb);
    }
    uVar5 = archive_le32dec((void *)((long)piVar9 + 0x12));
    *(ulong *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) = (ulong)uVar5;
    uVar5 = archive_le32dec((void *)((long)piVar9 + 0x16));
    *(ulong *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) = (ulong)uVar5;
    uVar4 = archive_le16dec((void *)((long)piVar9 + 0x1a));
    min = (ulong)uVar4;
    uVar4 = archive_le16dec(piVar9 + 7);
    min_00 = (ulong)uVar4;
    __archive_read_consume(a,0x1e);
    pcVar11 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
    if (pcVar11 == (char *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 0x800) == 0) {
        if (zip->sconv == (archive_string_conv *)0x0) {
          zip_entry = (zip_entry *)zip->sconv_default;
        }
        else {
          zip_entry = (zip_entry *)zip->sconv;
        }
      }
      else {
        if (zip->sconv_utf8 == (archive_string_conv *)0x0) {
          paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
          zip->sconv_utf8 = paVar8;
          if (zip->sconv_utf8 == (archive_string_conv *)0x0) {
            return L'\xffffffe2';
          }
        }
        zip_entry = (zip_entry *)zip->sconv_utf8;
      }
      wVar6 = _archive_entry_copy_pathname_l(entry,pcVar11,min,(archive_string_conv *)zip_entry);
      if (wVar6 != L'\0') {
        piVar9 = __errno_location();
        if (*piVar9 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
          return L'\xffffffe2';
        }
        pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)zip_entry);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar11);
        i._4_4_ = L'\xffffffec';
      }
      __archive_read_consume(a,min);
      pcVar11 = (char *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
      if (pcVar11 == (char *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        wVar6 = process_extra(a,entry,pcVar11,min_00,
                              (zip_entry *)zip_entry_central_dir.aes_extra._4_8_);
        if (wVar6 == L'\0') {
          __archive_read_consume(a,min_00);
          if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xf000) == 0x1000) {
            *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                 *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xfff;
            *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                 *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) | 0x8000;
          }
          if (*(short *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) == 0) {
            *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                 *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) | 0x1b4;
          }
          if (((*(char *)(zip_entry_central_dir.aes_extra._4_8_ + 0x81) == '\0') &&
              (pwVar12 = archive_entry_pathname_w(entry), pwVar12 != (wchar_t *)0x0)) &&
             ((pwVar13 = wcschr(pwVar12,L'/'), pwVar13 == (wchar_t *)0x0 &&
              (pwVar13 = wcschr(pwVar12,L'\\'), pwVar13 != (wchar_t *)0x0)))) {
            _auStack_128 = (wchar_t *)0x0;
            s.length = 0;
            s.s = (wchar_t *)0x0;
            if (pwVar12 == (wchar_t *)0x0) {
              local_198 = 0;
            }
            else {
              local_198 = wcslen(pwVar12);
            }
            archive_wstrncat((archive_wstring *)auStack_128,pwVar12,local_198);
            for (s.buffer_length = 0; s.buffer_length < s.s; s.buffer_length = s.buffer_length + 1)
            {
              if (_auStack_128[s.buffer_length] == L'\\') {
                _auStack_128[s.buffer_length] = L'/';
              }
            }
            archive_entry_copy_pathname_w(entry,_auStack_128);
            archive_wstring_free((archive_wstring *)auStack_128);
          }
          if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xf000) != 0x4000) {
            pwVar12 = archive_entry_pathname_w(entry);
            if (pwVar12 == (wchar_t *)0x0) {
              pcVar11 = archive_entry_pathname(entry);
              if (pcVar11 == (char *)0x0) {
                local_1a8 = 0;
              }
              else {
                local_1a8 = strlen(pcVar11);
              }
              bVar15 = false;
              if (local_1a8 != 0) {
                bVar15 = pcVar11[local_1a8 - 1] == '/';
              }
            }
            else {
              sVar14 = wcslen(pwVar12);
              bVar15 = false;
              if (sVar14 != 0) {
                bVar15 = pwVar12[sVar14 - 1] == L'/';
              }
            }
            if (bVar15) {
              *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                   *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xfff;
              *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                   *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) | 0x4000;
              *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                   *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) | 0x49;
            }
            else if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xf000) == 0) {
              *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) =
                   *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) | 0x8000;
            }
          }
          if ((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c) & 0xf000) == 0x4000) {
            pwVar12 = archive_entry_pathname_w(entry);
            if (pwVar12 == (wchar_t *)0x0) {
              pcVar11 = archive_entry_pathname(entry);
              if (pcVar11 == (char *)0x0) {
                local_1b8 = 0;
              }
              else {
                local_1b8 = strlen(pcVar11);
              }
              if ((local_1b8 != 0) && (pcVar11[local_1b8 - 1] != '/')) {
                linkname_length = 0;
                s_2.s = (char *)0x0;
                s_2.length = 0;
                archive_strcat((archive_string *)&linkname_length,pcVar11);
                archive_strappend_char((archive_string *)&linkname_length,'/');
                archive_entry_set_pathname(entry,(char *)linkname_length);
                archive_string_free((archive_string *)&linkname_length);
              }
            }
            else {
              sVar14 = wcslen(pwVar12);
              if ((sVar14 != 0) && (pwVar12[sVar14 - 1] != L'/')) {
                s_2.buffer_length = 0;
                archive_wstrcat((archive_wstring *)&s_2.buffer_length,pwVar12);
                archive_wstrappend_wchar((archive_wstring *)&s_2.buffer_length,L'/');
                archive_entry_copy_pathname_w(entry,(wchar_t *)s_2.buffer_length);
                archive_wstring_free((archive_wstring *)&s_2.buffer_length);
              }
            }
          }
          if ((*(byte *)(zip_entry_central_dir.aes_extra._4_8_ + 0x82) & 2) != 0) {
            *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) =
                 *(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 0xfff7;
            if (*(int *)(zip_entry_central_dir.aes_extra._4_8_ + 0x78) == 0) {
              *(int *)(zip_entry_central_dir.aes_extra._4_8_ + 0x78) =
                   (int)zip_entry_central_dir.ctime;
            }
            else if ((zip->ignore_crc32 == '\0') &&
                    (*(int *)(zip_entry_central_dir.aes_extra._4_8_ + 0x78) !=
                     (int)zip_entry_central_dir.ctime)) {
              archive_set_error(&a->archive,0x54,"Inconsistent CRC32 values");
              i._4_4_ = L'\xffffffec';
            }
            if ((*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) == 0) ||
               (*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) == 0xffffffff)) {
              *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) =
                   zip_entry_central_dir.local_header_offset;
            }
            else if (*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) !=
                     zip_entry_central_dir.local_header_offset) {
              archive_set_error(&a->archive,0x54,
                                "Inconsistent compressed size: %jd in central directory, %jd in local header"
                                ,zip_entry_central_dir.local_header_offset,
                                *(undefined8 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28));
              i._4_4_ = L'\xffffffec';
            }
            if ((*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) == 0) ||
               (*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) == 0xffffffff)) {
              *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) =
                   zip_entry_central_dir.compressed_size;
            }
            else if (*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) !=
                     zip_entry_central_dir.compressed_size) {
              archive_set_error(&a->archive,0x54,
                                "Inconsistent uncompressed size: %jd in central directory, %jd in local header"
                                ,zip_entry_central_dir.compressed_size,
                                *(undefined8 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30));
              i._4_4_ = L'\xffffffec';
            }
          }
          archive_entry_set_mode
                    (entry,(uint)*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7c));
          archive_entry_set_uid(entry,*(la_int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x40))
          ;
          archive_entry_set_gid(entry,*(la_int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x38))
          ;
          archive_entry_set_mtime(entry,*(time_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x60),0)
          ;
          archive_entry_set_ctime(entry,*(time_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x70),0)
          ;
          archive_entry_set_atime(entry,*(time_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x68),0)
          ;
          if ((zip->entry->mode & 0xf000) == 0xa000) {
            if (0x10000 < *(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28)) {
              archive_set_error(&a->archive,-1,"Zip file with oversized link entry");
              return L'\xffffffe2';
            }
            linkname_full_length = *(size_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28);
            archive_entry_set_size(entry,0);
            sStack_170 = linkname_full_length;
            if (zip->entry->compression == '\0') {
              h = __archive_read_ahead(a,linkname_full_length,(ssize_t *)0x0);
            }
            else {
              uncompressed_buffer._4_4_ = L'\xffffffe2';
              local_180 = (void *)0x0;
              uVar1 = zip->entry->compression;
              if (uVar1 == '\b') {
                zip->entry_bytes_remaining =
                     *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28);
                uncompressed_buffer._4_4_ =
                     zip_read_data_deflate(a,&local_180,&stack0xfffffffffffffe90,(int64_t *)0x0);
              }
              else if (uVar1 == '\x0e') {
                zip->entry_bytes_remaining =
                     *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28);
                uncompressed_buffer._4_4_ =
                     zip_read_data_zipx_lzma_alone
                               (a,&local_180,&stack0xfffffffffffffe90,(int64_t *)0x0);
              }
              if (uncompressed_buffer._4_4_ != L'\0') {
                bVar2 = zip->entry->compression;
                pcVar11 = compression_name((uint)zip->entry->compression);
                archive_set_error(&a->archive,0x54,
                                  "Unsupported ZIP compression method during decompression of link entry (%d: %s)"
                                  ,(ulong)bVar2,pcVar11);
                return L'\xffffffe7';
              }
              h = local_180;
            }
            if (h == (void *)0x0) {
              archive_set_error(&a->archive,-1,"Truncated Zip file");
              return L'\xffffffe2';
            }
            zip_entry = (zip_entry *)zip->sconv;
            if ((zip_entry == (zip_entry *)0x0) && ((zip->entry->zip_flags & 0x800) != 0)) {
              zip_entry = (zip_entry *)zip->sconv_utf8;
            }
            if (zip_entry == (zip_entry *)0x0) {
              zip_entry = (zip_entry *)zip->sconv_default;
            }
            wVar6 = _archive_entry_copy_symlink_l
                              (entry,(char *)h,sStack_170,(archive_string_conv *)zip_entry);
            if (wVar6 != L'\0') {
              piVar9 = __errno_location();
              if (((*piVar9 != 0xc) && (zip_entry == (zip_entry *)zip->sconv_utf8)) &&
                 ((zip->entry->zip_flags & 0x800) != 0)) {
                _archive_entry_copy_symlink_l(entry,(char *)h,sStack_170,(archive_string_conv *)0x0)
                ;
              }
              piVar9 = __errno_location();
              if (*piVar9 == 0xc) {
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Symlink");
                return L'\xffffffe2';
              }
              if ((zip_entry != (zip_entry *)zip->sconv_utf8) ||
                 ((zip->entry->zip_flags & 0x800) == 0)) {
                pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)zip_entry);
                archive_set_error(&a->archive,0x54,
                                  "Symlink cannot be converted from %s to current locale.",pcVar11);
                i._4_4_ = L'\xffffffec';
              }
            }
            *(undefined8 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28) = 0;
            *(undefined8 *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) = 0;
            iVar10 = __archive_read_consume(a,linkname_full_length);
            if (iVar10 < 0) {
              archive_set_error(&a->archive,-1,"Read error skipping symlink target name");
              return L'\xffffffe2';
            }
          }
          else if (((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 8) == 0) ||
                  ((0 < *(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) &&
                   (*(long *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30) != 0xffffffff)))) {
            archive_entry_set_size
                      (entry,*(la_int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x30));
          }
          zip->entry_bytes_remaining = *(int64_t *)(zip_entry_central_dir.aes_extra._4_8_ + 0x28);
          if (((*(ushort *)(zip_entry_central_dir.aes_extra._4_8_ + 0x7e) & 8) == 0) &&
             (zip->entry_bytes_remaining < 1)) {
            zip->end_of_entry = '\x01';
          }
          (zip->format_name).length = 0;
          pcVar11 = compression_name((uint)zip->entry->compression);
          archive_string_sprintf
                    (&zip->format_name,"ZIP %d.%d (%s)",(ulong)(uint)((int)(char)iVar3 / 10),
                     (ulong)(uint)((int)(char)iVar3 % 10),pcVar11);
          (a->archive).archive_format_name = (zip->format_name).s;
          a_local._4_4_ = i._4_4_;
        }
        else {
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  else {
    archive_set_error(&a->archive,-1,"Damaged Zip archive");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_local_file_header(struct archive_read *a, struct archive_entry *entry,
    struct zip *zip)
{
	const char *p;
	const void *h;
	const wchar_t *wp;
	const char *cp;
	size_t len, filename_length, extra_length;
	struct archive_string_conv *sconv;
	struct zip_entry *zip_entry = zip->entry;
	struct zip_entry zip_entry_central_dir;
	int ret = ARCHIVE_OK;
	char version;

	/* Save a copy of the original for consistency checks. */
	zip_entry_central_dir = *zip_entry;

	zip->decompress_init = 0;
	zip->end_of_entry = 0;
	zip->entry_uncompressed_bytes_read = 0;
	zip->entry_compressed_bytes_read = 0;
	zip->computed_crc32 = zip->crc32func(0, NULL, 0);

	/* Setup default conversion. */
	if (zip->sconv == NULL && !zip->init_default_conversion) {
		zip->sconv_default =
		    archive_string_default_conversion_for_read(&(a->archive));
		zip->init_default_conversion = 1;
	}

	if ((p = __archive_read_ahead(a, 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_FATAL;
	}
	version = p[4];
	zip_entry->system = p[5];
	zip_entry->zip_flags = archive_le16dec(p + 6);
	if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_entry_set_is_data_encrypted(entry, 1);
		if (zip_entry->zip_flags & ZIP_CENTRAL_DIRECTORY_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_STRONG_ENCRYPTED) {
			archive_entry_set_is_metadata_encrypted(entry, 1);
			return ARCHIVE_FATAL;
		}
	}
	zip->init_decryption = (zip_entry->zip_flags & ZIP_ENCRYPTED);
	zip_entry->compression = (char)archive_le16dec(p + 8);
	zip_entry->mtime = dos_to_unix(archive_le32dec(p + 10));
	zip_entry->crc32 = archive_le32dec(p + 14);
	if (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
		zip_entry->decdat = p[11];
	else
		zip_entry->decdat = p[17];
	zip_entry->compressed_size = archive_le32dec(p + 18);
	zip_entry->uncompressed_size = archive_le32dec(p + 22);
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	__archive_read_consume(a, 30);

	/* Read the filename. */
	if ((h = __archive_read_ahead(a, filename_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}
	if (zip_entry->zip_flags & ZIP_UTF8_NAME) {
		/* The filename is stored to be UTF-8. */
		if (zip->sconv_utf8 == NULL) {
			zip->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&a->archive, "UTF-8", 1);
			if (zip->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = zip->sconv_utf8;
	} else if (zip->sconv != NULL)
		sconv = zip->sconv;
	else
		sconv = zip->sconv_default;

	if (archive_entry_copy_pathname_l(entry,
	    h, filename_length, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	__archive_read_consume(a, filename_length);

	/* Read the extra data. */
	if ((h = __archive_read_ahead(a, extra_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (ARCHIVE_OK != process_extra(a, entry, h, extra_length,
	    zip_entry)) {
		return ARCHIVE_FATAL;
	}
	__archive_read_consume(a, extra_length);

	/* Work around a bug in Info-Zip: When reading from a pipe, it
	 * stats the pipe instead of synthesizing a file entry. */
	if ((zip_entry->mode & AE_IFMT) == AE_IFIFO) {
		zip_entry->mode &= ~ AE_IFMT;
		zip_entry->mode |= AE_IFREG;
	}

	/* If the mode is totally empty, set some sane default. */
	if (zip_entry->mode == 0) {
		zip_entry->mode |= 0664;
	}

	/* Windows archivers sometimes use backslash as the directory
	 * separator. Normalize to slash. */
	if (zip_entry->system == 0 &&
	    (wp = archive_entry_pathname_w(entry)) != NULL) {
		if (wcschr(wp, L'/') == NULL && wcschr(wp, L'\\') != NULL) {
			size_t i;
			struct archive_wstring s;
			archive_string_init(&s);
			archive_wstrcpy(&s, wp);
			for (i = 0; i < archive_strlen(&s); i++) {
				if (s.s[i] == '\\')
					s.s[i] = '/';
			}
			archive_entry_copy_pathname_w(entry, s.s);
			archive_wstring_free(&s);
		}
	}

	/* Make sure that entries with a trailing '/' are marked as directories
	 * even if the External File Attributes contains bogus values.  If this
	 * is not a directory and there is no type, assume a regular file. */
	if ((zip_entry->mode & AE_IFMT) != AE_IFDIR) {
		int has_slash;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			has_slash = len > 0 && wp[len - 1] == L'/';
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			has_slash = len > 0 && cp[len - 1] == '/';
		}
		/* Correct file type as needed. */
		if (has_slash) {
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFDIR;
			zip_entry->mode |= 0111;
		} else if ((zip_entry->mode & AE_IFMT) == 0) {
			zip_entry->mode |= AE_IFREG;
		}
	}

	/* Make sure directories end in '/' */
	if ((zip_entry->mode & AE_IFMT) == AE_IFDIR) {
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			if (len > 0 && wp[len - 1] != L'/') {
				struct archive_wstring s;
				archive_string_init(&s);
				archive_wstrcat(&s, wp);
				archive_wstrappend_wchar(&s, L'/');
				archive_entry_copy_pathname_w(entry, s.s);
				archive_wstring_free(&s);
			}
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			if (len > 0 && cp[len - 1] != '/') {
				struct archive_string s;
				archive_string_init(&s);
				archive_strcat(&s, cp);
				archive_strappend_char(&s, '/');
				archive_entry_set_pathname(entry, s.s);
				archive_string_free(&s);
			}
		}
	}

	if (zip_entry->flags & LA_FROM_CENTRAL_DIRECTORY) {
		/* If this came from the central dir, its size info
		 * is definitive, so ignore the length-at-end flag. */
		zip_entry->zip_flags &= ~ZIP_LENGTH_AT_END;
		/* If local header is missing a value, use the one from
		   the central directory.  If both have it, warn about
		   mismatches. */
		if (zip_entry->crc32 == 0) {
			zip_entry->crc32 = zip_entry_central_dir.crc32;
		} else if (!zip->ignore_crc32
		    && zip_entry->crc32 != zip_entry_central_dir.crc32) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent CRC32 values");
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->compressed_size == 0
		    || zip_entry->compressed_size == 0xffffffff) {
			zip_entry->compressed_size
			    = zip_entry_central_dir.compressed_size;
		} else if (zip_entry->compressed_size
		    != zip_entry_central_dir.compressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent compressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.compressed_size,
			    (intmax_t)zip_entry->compressed_size);
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->uncompressed_size == 0 ||
			zip_entry->uncompressed_size == 0xffffffff) {
			zip_entry->uncompressed_size
			    = zip_entry_central_dir.uncompressed_size;
		} else if (zip_entry->uncompressed_size
		    != zip_entry_central_dir.uncompressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent uncompressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.uncompressed_size,
			    (intmax_t)zip_entry->uncompressed_size);
			ret = ARCHIVE_WARN;
		}
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	archive_entry_set_uid(entry, zip_entry->uid);
	archive_entry_set_gid(entry, zip_entry->gid);
	archive_entry_set_mtime(entry, zip_entry->mtime, 0);
	archive_entry_set_ctime(entry, zip_entry->ctime, 0);
	archive_entry_set_atime(entry, zip_entry->atime, 0);

	if ((zip->entry->mode & AE_IFMT) == AE_IFLNK) {
		size_t linkname_length;

		if (zip_entry->compressed_size > 64 * 1024) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Zip file with oversized link entry");
			return ARCHIVE_FATAL;
		}

		linkname_length = (size_t)zip_entry->compressed_size;

		archive_entry_set_size(entry, 0);

		// take into account link compression if any
		size_t linkname_full_length = linkname_length;
		if (zip->entry->compression != 0)
		{
			// symlink target string appeared to be compressed
			int status = ARCHIVE_FATAL;
			const void *uncompressed_buffer = NULL;

			switch (zip->entry->compression)
			{
#if HAVE_ZLIB_H
				case 8: /* Deflate compression. */
					zip->entry_bytes_remaining = zip_entry->compressed_size;
					status = zip_read_data_deflate(a, &uncompressed_buffer,
						&linkname_full_length, NULL);
					break;
#endif
#if HAVE_LZMA_H && HAVE_LIBLZMA
				case 14: /* ZIPx LZMA compression. */
					/*(see zip file format specification, section 4.4.5)*/
					zip->entry_bytes_remaining = zip_entry->compressed_size;
					status = zip_read_data_zipx_lzma_alone(a, &uncompressed_buffer,
						&linkname_full_length, NULL);
					break;
#endif
				default: /* Unsupported compression. */
					break;
			}
			if (status == ARCHIVE_OK)
			{
				p = uncompressed_buffer;
			}
			else
			{
				archive_set_error(&a->archive,
					ARCHIVE_ERRNO_FILE_FORMAT,
					"Unsupported ZIP compression method "
					"during decompression of link entry (%d: %s)",
					zip->entry->compression,
					compression_name(zip->entry->compression));
				return ARCHIVE_FAILED;
			}
		}
		else
		{
			p = __archive_read_ahead(a, linkname_length, NULL);
		}

		if (p == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated Zip file");
			return ARCHIVE_FATAL;
		}

		sconv = zip->sconv;
		if (sconv == NULL && (zip->entry->zip_flags & ZIP_UTF8_NAME))
			sconv = zip->sconv_utf8;
		if (sconv == NULL)
			sconv = zip->sconv_default;
		if (archive_entry_copy_symlink_l(entry, p, linkname_full_length,
		    sconv) != 0) {
			if (errno != ENOMEM && sconv == zip->sconv_utf8 &&
			    (zip->entry->zip_flags & ZIP_UTF8_NAME))
			    archive_entry_copy_symlink_l(entry, p,
				linkname_full_length, NULL);
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symlink");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Since there is no character-set regulation for
			 * symlink name, do not report the conversion error
			 * in an automatic conversion.
			 */
			if (sconv != zip->sconv_utf8 ||
			    (zip->entry->zip_flags & ZIP_UTF8_NAME) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symlink cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
					sconv));
				ret = ARCHIVE_WARN;
			}
		}
		zip_entry->uncompressed_size = zip_entry->compressed_size = 0;

		if (__archive_read_consume(a, linkname_length) < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Read error skipping symlink target name");
			return ARCHIVE_FATAL;
		}
	} else if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	   || (zip_entry->uncompressed_size > 0
	       && zip_entry->uncompressed_size != 0xffffffff)) {
		/* Set the size only if it's meaningful. */
		archive_entry_set_size(entry, zip_entry->uncompressed_size);
	}
	zip->entry_bytes_remaining = zip_entry->compressed_size;

	/* If there's no body, force read_data() to return EOF immediately. */
	if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	/* Set up a more descriptive format name. */
        archive_string_empty(&zip->format_name);
	archive_string_sprintf(&zip->format_name, "ZIP %d.%d (%s)",
	    version / 10, version % 10,
	    compression_name(zip->entry->compression));
	a->archive.archive_format_name = zip->format_name.s;

	return (ret);
}